

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

AffineSpace3ff * __thiscall embree::XMLLoader::loadQuaternion(XMLLoader *this,Ref<embree::XML> *xml)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  byte cast;
  size_type sVar4;
  long *in_RDX;
  AffineSpace3ff *in_RDI;
  float fVar5;
  float fVar6;
  float fVar7;
  Quaternion3f Q;
  Vec4f q;
  Vec3f translate;
  Vec3f skew;
  Vec3f shift;
  Vec3f scale;
  AffineSpace3ff *res;
  __m128 c;
  __m128 r;
  __m128 a;
  undefined4 in_stack_ffffffffffffedc8;
  undefined4 in_stack_ffffffffffffedcc;
  undefined4 in_stack_ffffffffffffedd0;
  undefined4 in_stack_ffffffffffffedd4;
  string *in_stack_ffffffffffffee10;
  string *parmID;
  XML *in_stack_ffffffffffffee18;
  XML *this_00;
  Token *this_01;
  undefined4 in_stack_ffffffffffffee38;
  undefined4 in_stack_ffffffffffffee3c;
  string *str;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined1 local_fd8 [8];
  undefined8 uStack_fd0;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  undefined1 local_f78 [16];
  undefined1 local_f68 [16];
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined1 local_f38 [16];
  undefined1 local_f28 [16];
  undefined1 local_f18 [23];
  undefined1 local_f01 [33];
  string local_ee0 [36];
  undefined4 local_ebc [3];
  float local_eb0;
  allocator local_ea9;
  string local_ea8 [32];
  string local_e88 [32];
  undefined1 local_e68 [12];
  float local_e5c;
  undefined1 local_e58 [8];
  ulong uStack_e50;
  float local_e48 [2];
  undefined4 local_e40;
  float local_e3c;
  undefined1 local_e38 [4];
  undefined1 local_e34 [4];
  undefined1 local_e30 [7];
  allocator local_e29;
  string local_e28 [32];
  string local_e08 [36];
  float local_de4;
  undefined4 local_de0;
  uint local_ddc;
  float local_dd8;
  undefined1 local_dd1 [33];
  string local_db0 [39];
  allocator local_d89;
  string local_d88 [32];
  string local_d68 [32];
  undefined4 local_d48;
  undefined4 local_d44;
  undefined4 local_d40;
  allocator local_d39;
  string local_d38 [32];
  string local_d18 [39];
  allocator local_cf1;
  string local_cf0 [32];
  string local_cd0 [32];
  undefined4 local_cb0;
  undefined4 local_cac;
  undefined4 local_ca8;
  allocator local_ca1;
  string local_ca0 [32];
  string local_c80 [39];
  allocator local_c59;
  string local_c58 [32];
  string local_c38 [32];
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  allocator local_c09;
  string local_c08 [32];
  string local_be8 [39];
  allocator local_bc1;
  string local_bc0 [32];
  string local_ba0 [32];
  undefined4 local_b80;
  undefined4 local_b7c;
  undefined4 local_b78;
  allocator local_b61;
  string local_b60 [32];
  string local_b40 [32];
  undefined4 local_b20;
  undefined4 local_b1c;
  undefined4 local_b18;
  undefined4 local_b14;
  float local_b10;
  undefined4 local_b0c;
  uint local_b08;
  float local_b04 [6];
  undefined4 local_aec;
  undefined4 local_ae8;
  undefined4 local_ae4;
  undefined4 local_ae0;
  undefined4 local_adc;
  undefined4 local_ad8;
  undefined4 local_ad4;
  undefined4 local_ad0;
  undefined4 local_acc;
  undefined4 local_ac8;
  undefined4 local_ac4;
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined4 local_ab4;
  undefined4 local_ab0;
  undefined4 local_aac;
  undefined4 local_aa8;
  undefined4 local_aa4;
  long *local_aa0;
  long *local_a88;
  long *local_a80;
  long *local_a78;
  long *local_a70;
  long *local_a68;
  long *local_a60;
  long *local_a58;
  long *local_a50;
  long *local_a48;
  long *local_a40;
  long *local_a38;
  long *local_a30;
  long *local_a28;
  long *local_a20;
  long *local_a18;
  long *local_a10;
  long *local_a08;
  long *local_a00;
  long *local_9f8;
  long *local_9f0;
  long *local_9e8;
  long *local_9e0;
  long *local_9d8;
  long *local_9d0;
  long *local_9c8;
  long *local_9c0;
  long *local_9b8;
  long *local_9b0;
  undefined4 *local_9a0;
  undefined4 *local_998;
  undefined4 *local_990;
  undefined4 *local_988;
  undefined4 *local_980;
  undefined4 *local_978;
  undefined4 *local_970;
  undefined4 *local_968;
  undefined4 *local_960;
  undefined4 *local_958;
  undefined4 *local_950;
  undefined4 *local_948;
  float *local_940;
  float *local_938;
  float *local_930;
  float *local_928;
  uint local_91c;
  undefined4 local_918;
  float local_914;
  undefined1 *local_910;
  undefined4 *local_908;
  undefined4 *local_900;
  undefined4 *local_8f8;
  undefined4 *local_8f0;
  float *local_8e8;
  float *local_8e0;
  undefined1 *local_8d8;
  undefined1 *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  undefined4 *local_8b8;
  undefined4 *local_8b0;
  undefined4 *local_8a8;
  undefined4 *local_8a0;
  undefined4 *local_898;
  undefined4 *local_890;
  undefined4 *local_888;
  float *local_880;
  undefined4 *local_878;
  float *local_870;
  undefined1 *local_868;
  float *local_860;
  float *local_858;
  float *local_850;
  float local_848 [3];
  float local_83c;
  float local_838 [3];
  float local_82c;
  float *local_828;
  float *local_820;
  float *local_818;
  undefined1 *local_810;
  float *local_808;
  float local_800;
  undefined4 local_7fc;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined1 *local_7f0;
  undefined4 local_7e8;
  undefined4 local_7e4;
  undefined4 local_7e0;
  undefined4 local_7dc;
  undefined1 *local_7d8;
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined4 local_7c8;
  undefined4 local_7c4;
  undefined1 *local_7c0;
  float local_7b8;
  undefined4 local_7b4;
  undefined4 local_7b0;
  undefined4 local_7ac;
  undefined1 *local_7a8;
  float local_7a0;
  float local_79c;
  float local_798;
  float local_794;
  undefined8 *local_790;
  float local_788;
  float local_784;
  float local_780;
  float local_77c;
  undefined8 *local_778;
  float local_770;
  float local_76c;
  float local_768;
  float local_764;
  undefined8 *local_760;
  undefined8 *local_740;
  undefined8 *local_738;
  undefined8 *local_730;
  undefined8 *local_728;
  undefined8 *local_720;
  undefined8 *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  undefined8 *local_6a8;
  undefined1 *local_6a0;
  undefined8 *local_698;
  undefined8 *local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 *local_678;
  undefined8 *local_670;
  undefined8 *local_668;
  undefined8 *local_660;
  undefined8 *local_658;
  undefined8 *local_650;
  undefined8 *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  undefined8 *local_630;
  undefined8 *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  float local_5d0;
  float local_5cc;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  float local_598;
  float local_594;
  float local_590;
  float local_58c;
  undefined8 local_588;
  undefined8 uStack_580;
  float local_578;
  float local_574;
  float local_570;
  float local_56c;
  undefined8 local_568;
  undefined8 uStack_560;
  float local_558;
  float local_554;
  float local_550;
  float local_54c;
  undefined8 uStack_540;
  undefined4 local_538;
  undefined4 local_534;
  undefined4 local_530;
  float local_52c;
  undefined4 local_518;
  undefined4 local_514;
  undefined4 local_510;
  undefined4 local_50c;
  undefined4 local_4f8;
  undefined4 local_4f4;
  undefined4 local_4f0;
  undefined4 local_4ec;
  undefined4 local_4d8;
  undefined4 local_4d4;
  undefined4 local_4d0;
  float local_4cc;
  ulong uStack_4c0;
  float local_4b8;
  undefined4 local_4b4;
  uint local_4b0;
  undefined4 local_4ac;
  undefined1 *local_490;
  undefined1 *local_470;
  undefined1 *local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 *local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 *local_3f0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined1 *local_370;
  undefined8 *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  undefined1 *local_338;
  Vector *local_330;
  float local_324;
  float local_320;
  float local_31c;
  float *local_318;
  float *local_310;
  float *local_308;
  float *local_300;
  float *local_2f8;
  float *local_2f0;
  float *local_2e8;
  float local_2dc;
  float *local_2d8;
  float *local_2d0;
  ulong local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [16];
  ulong local_2a8;
  undefined8 uStack_2a0;
  float local_28c;
  undefined1 local_288 [16];
  undefined4 local_26c;
  undefined1 local_268 [16];
  undefined4 local_24c;
  undefined1 local_248 [16];
  float local_22c;
  ulong local_228;
  undefined8 uStack_220;
  ulong local_218;
  undefined8 uStack_210;
  ulong local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  ulong local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  ulong local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  ulong local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  ulong local_168;
  undefined8 uStack_160;
  ulong local_158;
  undefined8 uStack_150;
  float *local_140;
  float *local_138;
  float *local_130;
  float local_124;
  float local_120;
  float local_11c;
  float *local_118;
  float *local_110;
  float *local_108;
  float *local_100;
  float *local_f8;
  float *local_f0;
  float *local_e8;
  float *local_e0;
  float *local_d8;
  float *local_d0;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  undefined1 *local_58;
  undefined1 *local_48;
  Vector *local_40;
  undefined1 *local_38;
  Vector *local_30;
  undefined1 *local_28;
  Vector *local_10;
  Vector *local_8;
  
  local_ab0 = 0x3f800000;
  local_ab4 = 0x3f800000;
  local_ab8 = 0x3f800000;
  local_988 = &local_aac;
  local_990 = &local_ab0;
  local_998 = &local_ab4;
  local_9a0 = &local_ab8;
  local_aac = 0x3f800000;
  local_aa8 = 0x3f800000;
  local_aa4 = 0x3f800000;
  local_ac8 = 0;
  local_acc = 0;
  local_ad0 = 0;
  local_968 = &local_ac4;
  local_970 = &local_ac8;
  local_978 = &local_acc;
  local_980 = &local_ad0;
  local_ac4 = 0;
  local_ac0 = 0;
  local_abc = 0;
  local_ae0 = 0;
  local_ae4 = 0;
  local_ae8 = 0;
  local_948 = &local_adc;
  local_950 = &local_ae0;
  local_958 = &local_ae4;
  local_960 = &local_ae8;
  local_adc = 0;
  local_ad8 = 0;
  local_ad4 = 0;
  local_b04[3] = 0.0;
  local_b04[2] = 0.0;
  local_b04[1] = 0.0;
  local_928 = local_b04 + 4;
  local_930 = local_b04 + 3;
  local_938 = local_b04 + 2;
  local_940 = local_b04 + 1;
  local_b04[4] = 0.0;
  local_b04[5] = 0.0;
  local_aec = 0;
  local_b14 = 0;
  local_b18 = 0;
  local_b1c = 0;
  local_b20 = 0x3f800000;
  local_8e8 = &local_b10;
  local_8f0 = &local_b14;
  local_8f8 = &local_b18;
  local_900 = &local_b1c;
  local_908 = &local_b20;
  local_b10 = 0.0;
  local_b0c = 0;
  local_b08 = 0;
  local_b04[0] = 1.0;
  local_aa0 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b60,"translate",&local_b61);
  XML::parm(in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                          (char *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8));
  std::__cxx11::string::~string(local_b40);
  std::__cxx11::string::~string(local_b60);
  std::allocator<char>::~allocator((allocator<char> *)&local_b61);
  if (bVar3) {
    local_9b0 = local_aa0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_bc0,"translate",&local_bc1);
    XML::parm(in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
    string_to_Vec3f((string *)CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
    local_880 = local_b04 + 4;
    local_888 = &local_b80;
    local_b04[4] = (float)local_b80;
    local_b04[5] = (float)local_b7c;
    local_aec = local_b78;
    std::__cxx11::string::~string(local_ba0);
    std::__cxx11::string::~string(local_bc0);
    std::allocator<char>::~allocator((allocator<char> *)&local_bc1);
  }
  local_9b8 = local_aa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c08,"scale",&local_c09);
  XML::parm(in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                          (char *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8));
  std::__cxx11::string::~string(local_be8);
  std::__cxx11::string::~string(local_c08);
  std::allocator<char>::~allocator((allocator<char> *)&local_c09);
  if (bVar3) {
    local_9c0 = local_aa0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c58,"scale",&local_c59);
    XML::parm(in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
    string_to_Vec3f((string *)CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
    local_890 = &local_aac;
    local_898 = &local_c18;
    local_aac = local_c18;
    local_aa8 = local_c14;
    local_aa4 = local_c10;
    std::__cxx11::string::~string(local_c38);
    std::__cxx11::string::~string(local_c58);
    std::allocator<char>::~allocator((allocator<char> *)&local_c59);
  }
  local_9c8 = local_aa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ca0,"skew",&local_ca1);
  XML::parm(in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                          (char *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8));
  std::__cxx11::string::~string(local_c80);
  std::__cxx11::string::~string(local_ca0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ca1);
  if (bVar3) {
    local_9d0 = local_aa0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_cf0,"skew",&local_cf1);
    XML::parm(in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
    string_to_Vec3f((string *)CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
    local_8a0 = &local_adc;
    local_8a8 = &local_cb0;
    local_adc = local_cb0;
    local_ad8 = local_cac;
    local_ad4 = local_ca8;
    std::__cxx11::string::~string(local_cd0);
    std::__cxx11::string::~string(local_cf0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cf1);
  }
  local_9d8 = local_aa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d38,"shift",&local_d39);
  XML::parm(in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                          (char *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8));
  std::__cxx11::string::~string(local_d18);
  std::__cxx11::string::~string(local_d38);
  std::allocator<char>::~allocator((allocator<char> *)&local_d39);
  if (bVar3) {
    local_9e0 = local_aa0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d88,"shift",&local_d89);
    XML::parm(in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
    string_to_Vec3f((string *)CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
    local_8b0 = &local_ac4;
    local_8b8 = &local_d48;
    local_ac4 = local_d48;
    local_ac0 = local_d44;
    local_abc = local_d40;
    std::__cxx11::string::~string(local_d68);
    std::__cxx11::string::~string(local_d88);
    std::allocator<char>::~allocator((allocator<char> *)&local_d89);
  }
  local_9e8 = local_aa0;
  str = (string *)local_dd1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_dd1 + 1),"rotate",(allocator *)str);
  XML::parm(in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                          (char *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8));
  std::__cxx11::string::~string(local_db0);
  std::__cxx11::string::~string((string *)(local_dd1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_dd1);
  if (bVar3) {
    local_9f0 = local_aa0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e28,"rotate",&local_e29);
    XML::parm(in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
    string_to_Vec4f(str);
    local_850 = &local_b10;
    local_858 = &local_de4;
    local_b10 = local_de4;
    local_b0c = local_de0;
    local_b08 = local_ddc;
    local_b04[0] = local_dd8;
    std::__cxx11::string::~string(local_e08);
    std::__cxx11::string::~string(local_e28);
    std::allocator<char>::~allocator((allocator<char> *)&local_e29);
    local_828 = local_b04;
    local_b04[0] = local_b04[0] * 0.017453292;
    local_910 = local_e58;
    local_914 = local_b10;
    local_918 = local_b0c;
    local_91c = local_b08;
    local_4ac = 0;
    local_4b0 = local_b08;
    local_4b4 = local_b0c;
    local_4b8 = local_b10;
    uStack_4c0 = (ulong)local_b08;
    local_820 = local_e48;
    local_e48[0] = local_b10;
    local_e40 = (undefined4)uStack_e50;
    local_818 = &local_e3c;
    fVar5 = 0.5;
    local_5cc = local_b04[0] * 0.5;
    local_810 = local_910;
    local_808 = local_820;
    uStack_e50 = uStack_4c0;
    local_82c = cosf(local_5cc);
    local_5d0 = *local_828 * fVar5;
    local_83c = sinf(local_5d0);
    local_2d0 = local_848;
    local_2d8 = local_820;
    local_e0 = local_820;
    local_d0 = local_820;
    local_d8 = local_820;
    local_c0 = *local_820;
    local_b4 = local_820[1];
    local_c4 = *local_820;
    local_b8 = local_820[1];
    local_bc = local_820[2] * local_820[2];
    local_c8 = local_b4 * local_b8 + local_bc;
    local_28c = local_c0 * local_c4 + local_c8;
    local_248._4_4_ = 0;
    local_248._0_4_ = local_28c;
    local_2a8 = local_248._0_8_;
    uStack_2a0 = 0;
    local_228 = local_248._0_8_;
    uStack_220 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_248._0_8_;
    local_2b8 = rsqrtss(auVar1,auVar1);
    local_24c = 0x3fc00000;
    local_268 = ZEXT416(0x3fc00000);
    local_178 = local_2b8._0_8_;
    uVar2 = local_178;
    uStack_170 = local_2b8._8_8_;
    local_178._0_4_ = local_2b8._0_4_;
    local_168 = (ulong)(uint)((float)local_178 * 1.5);
    uStack_160 = 0;
    local_26c = 0xbf000000;
    local_288 = ZEXT416(0xbf000000);
    local_198 = local_288._0_8_;
    uStack_190 = 0;
    local_188 = (ulong)(uint)(local_28c * -0.5);
    uStack_180 = 0;
    local_1b8 = local_2b8._0_8_;
    uStack_1b0 = local_2b8._8_8_;
    local_2dc = local_28c * -0.5 * (float)local_178;
    local_1a8 = (ulong)(uint)local_2dc;
    uStack_1a0 = 0;
    local_1d8 = local_2b8._0_8_;
    uStack_1d0 = local_2b8._8_8_;
    local_1c8 = CONCAT44(local_2b8._4_4_,(float)local_178 * (float)local_178);
    uStack_1c0 = local_2b8._8_8_;
    local_1f8 = local_1c8;
    uStack_1f0 = local_2b8._8_8_;
    local_2dc = local_2dc * (float)local_178 * (float)local_178;
    local_1e8 = (ulong)(uint)local_2dc;
    uStack_1e0 = 0;
    local_218 = local_1e8;
    uStack_210 = 0;
    local_2dc = (float)local_178 * 1.5 + local_2dc;
    local_208 = (ulong)(uint)local_2dc;
    uStack_200 = 0;
    local_2c8 = local_208;
    uStack_2c0 = 0;
    local_158 = local_208;
    uStack_150 = 0;
    local_108 = local_848;
    local_110 = local_820;
    local_118 = &local_2dc;
    local_11c = *local_820 * local_2dc;
    local_e8 = local_848;
    local_f0 = &local_11c;
    local_f8 = &local_120;
    local_100 = &local_124;
    local_308 = local_838;
    local_310 = &local_83c;
    local_318 = local_848;
    local_31c = local_83c * local_11c;
    local_320 = local_83c * local_120;
    local_324 = local_83c * local_124;
    local_2e8 = local_838;
    local_2f0 = &local_31c;
    local_2f8 = &local_320;
    local_300 = &local_324;
    local_130 = &local_e3c;
    local_138 = &local_82c;
    local_140 = local_838;
    local_e3c = local_82c;
    local_b10 = local_838[0];
    local_8c8 = local_e38;
    local_8d0 = local_e34;
    local_8d8 = local_e30;
    local_8e0 = &local_e3c;
    local_8c0 = local_e68;
    local_860 = &local_b10;
    local_868 = local_e68;
    local_b0c = local_e68._4_4_;
    local_b08 = local_e68._8_4_;
    local_b04[0] = local_e5c;
    local_248 = ZEXT416((uint)local_28c);
    local_22c = local_28c;
    local_178 = uVar2;
    local_124 = local_820[2] * local_2dc;
    local_120 = local_820[1] * local_2dc;
    local_e5c = local_82c;
    local_848[0] = local_11c;
    local_838[0] = local_31c;
  }
  local_9f8 = local_aa0;
  this_01 = (Token *)*local_aa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ea8,"quaternion",&local_ea9);
  XML::parm(in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
  cast = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                         (char *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8));
  std::__cxx11::string::~string(local_e88);
  std::__cxx11::string::~string(local_ea8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ea9);
  if ((cast & 1) != 0) {
    local_a00 = local_aa0;
    parmID = (string *)*local_aa0;
    this_00 = (XML *)local_f01;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_f01 + 1),"quaternion",(allocator *)this_00);
    XML::parm(this_00,parmID);
    string_to_Vec4f(str);
    local_870 = &local_b10;
    local_878 = local_ebc;
    local_b10 = (float)local_ebc[0];
    local_b0c = local_ebc[1];
    local_b08 = local_ebc[2];
    local_b04[0] = local_eb0;
    std::__cxx11::string::~string(local_ee0);
    std::__cxx11::string::~string((string *)(local_f01 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_f01);
  }
  local_7f0 = local_f88;
  local_7f4 = local_aac;
  local_7f8 = local_ac4;
  local_7fc = local_ac0;
  local_800 = local_b10;
  local_4cc = local_b10;
  local_4d0 = local_ac0;
  local_4d4 = local_ac4;
  local_4d8 = local_aac;
  local_6e8 = local_f78;
  local_7d8 = local_fa8;
  local_7dc = local_adc;
  local_7e0 = local_aa8;
  local_7e4 = local_abc;
  local_7e8 = local_b0c;
  local_4ec = local_b0c;
  local_4f0 = local_abc;
  local_4f4 = local_aa8;
  local_4f8 = local_adc;
  local_6f8 = local_f98;
  local_7c0 = local_fc8;
  local_7c4 = local_ad8;
  local_7c8 = local_ad4;
  local_7cc = local_aa4;
  local_7d0 = local_b08;
  local_50c = local_b08;
  local_510 = local_aa4;
  local_514 = local_ad4;
  local_518 = local_ad8;
  local_708 = local_fb8;
  local_6c8 = local_f68;
  local_6a8 = &local_f58;
  local_698 = &local_f48;
  local_638 = local_f38;
  local_360 = local_f28;
  local_368 = &local_f58;
  local_370 = local_f18;
  local_378 = &local_f48;
  local_7a8 = local_fd8;
  local_7ac = local_b04[4];
  local_7b0 = local_b04[5];
  local_7b4 = local_aec;
  local_7b8 = local_b04[0];
  local_52c = local_b04[0];
  local_530 = local_aec;
  local_534 = local_b04[5];
  local_538 = local_b04[4];
  uStack_540 = CONCAT44(local_b04[0],local_aec);
  local_618 = local_f38;
  local_620 = local_fd8;
  local_10 = &(in_RDI->l).vy;
  local_8 = &(in_RDI->l).vz;
  *(ulong *)&(in_RDI->l).vx.field_0 = CONCAT44(local_ac4,local_aac);
  *(ulong *)((long)&(in_RDI->l).vx.field_0 + 8) = CONCAT44(local_b10,local_ac0);
  local_38 = local_f28;
  local_30 = &(in_RDI->l).vy;
  *(undefined8 *)&local_30->field_0 = local_f58;
  *(undefined8 *)((long)&(in_RDI->l).vy.field_0 + 8) = uStack_f50;
  local_48 = local_f18;
  local_40 = &(in_RDI->l).vz;
  *(undefined8 *)&local_40->field_0 = local_f48;
  *(undefined8 *)((long)&(in_RDI->l).vz.field_0 + 8) = uStack_f40;
  local_330 = &in_RDI->p;
  *(ulong *)&local_330->field_0 = CONCAT44(local_b04[5],local_b04[4]);
  *(undefined8 *)((long)&(in_RDI->p).field_0 + 8) = uStack_540;
  local_a08 = local_aa0;
  local_710 = local_7c0;
  local_700 = local_7d8;
  local_6f0 = local_7f0;
  local_6e0 = local_708;
  local_6d8 = local_6f8;
  local_6d0 = local_6e8;
  local_6c0 = local_6e8;
  local_6b8 = local_6c8;
  local_6b0 = local_6f8;
  local_6a0 = local_708;
  local_640 = local_6c8;
  local_490 = local_6e8;
  local_470 = local_6f8;
  local_450 = local_708;
  local_358 = local_6c8;
  local_350 = local_638;
  local_338 = local_620;
  local_58 = local_618;
  local_28 = local_618;
  uStack_fd0 = uStack_540;
  sVar4 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                    ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_aa0 + 0x98));
  if (sVar4 == 0x10) {
    local_a10 = local_aa0;
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_aa0 + 0x98),0);
    fVar5 = Token::Float(this_01,(bool)cast);
    local_a18 = local_aa0;
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_aa0 + 0x98),4);
    fVar6 = Token::Float(this_01,(bool)cast);
    local_a20 = local_aa0;
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_aa0 + 0x98),8);
    fVar7 = Token::Float(this_01,(bool)cast);
    local_a28 = local_aa0;
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_aa0 + 0x98),0xc);
    local_7a0 = Token::Float(this_01,(bool)cast);
    local_790 = &local_1098;
    local_568 = CONCAT44(fVar6,fVar5);
    uStack_560 = CONCAT44(local_7a0,fVar7);
    local_a30 = local_aa0;
    local_79c = fVar7;
    local_798 = fVar6;
    local_794 = fVar5;
    local_720 = local_790;
    local_718 = &local_1088;
    local_558 = fVar5;
    local_554 = fVar6;
    local_550 = fVar7;
    local_54c = local_7a0;
    local_448 = local_568;
    uStack_440 = uStack_560;
    local_430 = &local_1088;
    local_1098 = local_568;
    uStack_1090 = uStack_560;
    local_1088 = local_568;
    uStack_1080 = uStack_560;
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_aa0 + 0x98),1);
    fVar5 = Token::Float(this_01,(bool)cast);
    local_a38 = local_aa0;
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_aa0 + 0x98),5);
    fVar6 = Token::Float(this_01,(bool)cast);
    local_a40 = local_aa0;
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_aa0 + 0x98),9);
    fVar7 = Token::Float(this_01,(bool)cast);
    local_a48 = local_aa0;
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_aa0 + 0x98),0xd);
    local_788 = Token::Float(this_01,(bool)cast);
    local_778 = &local_10b8;
    local_588 = CONCAT44(fVar6,fVar5);
    uStack_580 = CONCAT44(local_788,fVar7);
    local_a50 = local_aa0;
    local_784 = fVar7;
    local_780 = fVar6;
    local_77c = fVar5;
    local_730 = local_778;
    local_728 = &local_10a8;
    local_578 = fVar5;
    local_574 = fVar6;
    local_570 = fVar7;
    local_56c = local_788;
    local_428 = local_588;
    uStack_420 = uStack_580;
    local_410 = &local_10a8;
    local_10b8 = local_588;
    uStack_10b0 = uStack_580;
    local_10a8 = local_588;
    uStack_10a0 = uStack_580;
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_aa0 + 0x98),2);
    fVar5 = Token::Float(this_01,(bool)cast);
    local_a58 = local_aa0;
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_aa0 + 0x98),6);
    fVar6 = Token::Float(this_01,(bool)cast);
    local_a60 = local_aa0;
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_aa0 + 0x98),10);
    fVar7 = Token::Float(this_01,(bool)cast);
    local_a68 = local_aa0;
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_aa0 + 0x98),0xe);
    local_770 = Token::Float(this_01,(bool)cast);
    local_760 = &local_10d8;
    local_5a8 = CONCAT44(fVar6,fVar5);
    uStack_5a0 = CONCAT44(local_770,fVar7);
    local_738 = &local_10c8;
    local_678 = &local_1078;
    local_1078 = local_1088;
    uStack_1070 = uStack_1080;
    local_658 = &local_1068;
    local_648 = &local_1058;
    local_628 = &local_1048;
    local_1048 = local_1088;
    uStack_1040 = uStack_1080;
    local_390 = &local_1038;
    local_398 = &local_1068;
    local_1038 = local_1068;
    uStack_1030 = uStack_1060;
    local_3a0 = &local_1028;
    local_3a8 = &local_1058;
    local_1028 = local_1058;
    uStack_1020 = uStack_1050;
    local_a70 = local_aa0;
    local_76c = fVar7;
    local_768 = fVar6;
    local_764 = fVar5;
    local_740 = local_760;
    local_690 = local_738;
    local_688 = &local_10a8;
    local_680 = &local_1088;
    local_670 = &local_1088;
    local_668 = local_678;
    local_660 = &local_10a8;
    local_650 = local_738;
    local_630 = local_678;
    local_598 = fVar5;
    local_594 = fVar6;
    local_590 = fVar7;
    local_58c = local_770;
    local_408 = local_5a8;
    uStack_400 = uStack_5a0;
    local_3f0 = local_738;
    local_388 = local_678;
    local_380 = local_628;
    local_10d8 = local_5a8;
    uStack_10d0 = uStack_5a0;
    local_10c8 = local_5a8;
    uStack_10c0 = uStack_5a0;
    local_1068 = local_10a8;
    uStack_1060 = uStack_10a0;
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_aa0 + 0x98),3);
    Token::Float(this_01,(bool)cast);
    local_a78 = local_aa0;
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_aa0 + 0x98),7);
    Token::Float(this_01,(bool)cast);
    local_a80 = local_aa0;
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_aa0 + 0x98),0xb);
    Token::Float(this_01,(bool)cast);
    local_a88 = local_aa0;
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_aa0 + 0x98),0xf);
    Token::Float(this_01,(bool)cast);
    *(undefined8 *)&(in_RDI->l).vx.field_0 = local_1048;
    *(undefined8 *)((long)&(in_RDI->l).vx.field_0 + 8) = uStack_1040;
    *(undefined8 *)&(in_RDI->l).vy.field_0 = local_1038;
    *(undefined8 *)((long)&(in_RDI->l).vy.field_0 + 8) = uStack_1030;
    *(undefined8 *)&(in_RDI->l).vz.field_0 = local_1028;
    *(undefined8 *)((long)&(in_RDI->l).vz.field_0 + 8) = uStack_1020;
    *(undefined8 *)&(in_RDI->p).field_0 = local_10e8;
    *(undefined8 *)((long)&(in_RDI->p).field_0 + 8) = uStack_10e0;
  }
  return in_RDI;
}

Assistant:

AffineSpace3ff XMLLoader::loadQuaternion(const Ref<XML>& xml)
  {
    Vec3f scale(1.f, 1.f, 1.f);
    Vec3f shift(0.f, 0.f, 0.f);
    Vec3f skew(0.f, 0.f, 0.f);
    Vec3f translate(0.f, 0.f, 0.f);
    Vec4f q(0.f, 0.f, 0.f, 1.f);

    if (xml->parm("translate") != "")
      translate = string_to_Vec3f(xml->parm("translate"));
    if (xml->parm("scale") != "")
      scale = string_to_Vec3f(xml->parm("scale"));
    if (xml->parm("skew") != "")
      skew = string_to_Vec3f(xml->parm("skew"));
    if (xml->parm("shift") != "")
      shift = string_to_Vec3f(xml->parm("shift"));
    if (xml->parm("rotate") != "") {
      q = string_to_Vec4f(xml->parm("rotate"));
      // convert from degree to radians
      q.w = 2.f*M_PI/360.f*q.w;
      Quaternion3f Q = Quaternion3f::rotate(Vec3fa(q.x, q.y, q.z), q.w);
      q = Vec4f(Q.i, Q.j, Q.k, Q.r);
    }
    if (xml->parm("quaternion") != "") {
      q = string_to_Vec4f(xml->parm("quaternion"));
    }

    AffineSpace3ff res(LinearSpace3fa(
      Vec3ff(scale.x, shift.x, shift.y, q.x),
      Vec3ff(skew.x, scale.y, shift.z, q.y),
      Vec3ff(skew.y, skew.z, scale.z, q.z)),
      Vec3ff(translate.x, translate.y, translate.z, q.w));

    if (xml->body.size() == 16) {
      res = AffineSpace3ff(LinearSpace3fa(Vec3ff(xml->body[ 0].Float(),xml->body[ 4].Float(),xml->body[ 8].Float(),xml->body[12].Float()),
                                          Vec3ff(xml->body[ 1].Float(),xml->body[ 5].Float(),xml->body[ 9].Float(),xml->body[13].Float()),
                                          Vec3ff(xml->body[ 2].Float(),xml->body[ 6].Float(),xml->body[10].Float(),xml->body[14].Float())),
                                          Vec3ff(xml->body[ 3].Float(),xml->body[ 7].Float(),xml->body[11].Float(),xml->body[15].Float()));
    }
    return res;
  }